

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_server_connection.c
# Opt level: O1

void json_server_connection_create
               (json_server_connection_t *self,msocket_t *msocket,apx_connection_tag *apx_connection
               )

{
  msocket_handler_t handler;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  code *pcStack_20;
  code *local_18;
  undefined8 uStack_10;
  
  if (apx_connection != (apx_connection_tag *)0x0 &&
      (msocket != (msocket_t *)0x0 && self != (json_server_connection_t *)0x0)) {
    self->msocket = msocket;
    self->apx_connection = apx_connection;
    uStack_10 = 0;
    local_28 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_18 = json_server_connection_data;
    pcStack_20 = json_server_connection_disconnected;
    msocket_set_handler(msocket,&local_38,self);
  }
  return;
}

Assistant:

void json_server_connection_create(json_server_connection_t *self, msocket_t *msocket, struct apx_connection_tag *apx_connection)
{
   if ( (self != 0) && (msocket != 0) && (apx_connection != 0) )
   {
      msocket_handler_t handler;
      self->msocket = msocket;
      self->apx_connection = apx_connection;
      memset(&handler, 0, sizeof(msocket_handler_t));
      handler.tcp_data = json_server_connection_data;
      handler.tcp_disconnected = json_server_connection_disconnected;
      msocket_sethandler(self->msocket, &handler, (void*) self);
   }
}